

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generation_iterator.cpp
# Opt level: O2

generation_iterator * __thiscall pstore::generation_iterator::operator++(generation_iterator *this)

{
  _func_int **local_20;
  
  database::getro<pstore::trailer,void>
            ((database *)&stack0xffffffffffffffe0,(typed_address<pstore::trailer>)this->db_);
  (this->pos_).a_.a_ = (value_type)local_20[4];
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  validate(this);
  return this;
}

Assistant:

generation_iterator & generation_iterator::operator++ () {
        pos_ = db_->getro<pstore::trailer> (pos_)->a.prev_generation;
        this->validate ();
        return *this;
    }